

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ExtensionGenerator::GenerateNonNestedInitializationCode
          (ExtensionGenerator *this,Printer *printer)

{
  char *pcVar1;
  int __c;
  int i;
  FieldDescriptor *in_RDX;
  java *this_00;
  string local_50;
  string local_30;
  
  this_00 = (java *)this->descriptor_;
  if ((*(long *)(this_00 + 0x40) == 0) &&
     (*(int *)(*(long *)(*(long *)(this_00 + 0x20) + 0x88) + 0x50) != 3)) {
    UnderscoresToCamelCase_abi_cxx11_(&local_30,this_00,in_RDX);
    pcVar1 = FieldDescriptor::index(this->descriptor_,(char *)this_00,__c);
    SimpleItoa_abi_cxx11_(&local_50,(protobuf *)((ulong)pcVar1 & 0xffffffff),i);
    io::Printer::Print(printer,"$name$.internalInit(descriptor.getExtensions().get($index$));\n",
                       "name",&local_30,"index",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void ExtensionGenerator::GenerateNonNestedInitializationCode(
    io::Printer* printer) {
  if (descriptor_->extension_scope() == NULL &&
      HasDescriptorMethods(descriptor_->file())) {
    // Only applies to non-nested, non-lite extensions.
    printer->Print(
        "$name$.internalInit(descriptor.getExtensions().get($index$));\n",
        "name", UnderscoresToCamelCase(descriptor_),
        "index", SimpleItoa(descriptor_->index()));
  }
}